

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_slot_management.c
# Opt level: O0

psa_status_t psa_load_persistent_key_into_slot(psa_key_slot_t *slot)

{
  size_t local_28;
  size_t key_data_length;
  uint8_t *key_data;
  psa_key_slot_t *ppStack_10;
  psa_status_t status;
  psa_key_slot_t *slot_local;
  
  key_data._4_4_ = 0;
  key_data_length = 0;
  local_28 = 0;
  ppStack_10 = slot;
  key_data._4_4_ = psa_load_persistent_key(&slot->attr,(uint8_t **)&key_data_length,&local_28);
  if (key_data._4_4_ == 0) {
    key_data._4_4_ = psa_import_key_into_slot(ppStack_10,(uint8_t *)key_data_length,local_28);
  }
  psa_free_persistent_key_data((uint8_t *)key_data_length,local_28);
  return key_data._4_4_;
}

Assistant:

static psa_status_t psa_load_persistent_key_into_slot( psa_key_slot_t *slot )
{
    psa_status_t status = PSA_SUCCESS;
    uint8_t *key_data = NULL;
    size_t key_data_length = 0;

    status = psa_load_persistent_key( &slot->attr,
                                      &key_data, &key_data_length );
    if( status != PSA_SUCCESS )
        goto exit;

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( psa_key_lifetime_is_external( slot->attr.lifetime ) )
    {
        psa_se_key_data_storage_t *data;
        if( key_data_length != sizeof( *data ) )
        {
            status = PSA_ERROR_STORAGE_FAILURE;
            goto exit;
        }
        data = (psa_se_key_data_storage_t *) key_data;
        memcpy( &slot->data.se.slot_number, &data->slot_number,
                sizeof( slot->data.se.slot_number ) );
        memcpy( &slot->attr.bits, &data->bits,
                sizeof( slot->attr.bits ) );
    }
    else
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
    {
        status = psa_import_key_into_slot( slot, key_data, key_data_length );
    }

exit:
    psa_free_persistent_key_data( key_data, key_data_length );
    return( status );
}